

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vision.c
# Opt level: O1

void unblock_point(int x,int y)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  size_t __n;
  int iVar5;
  long lVar6;
  char *__s;
  char cVar7;
  long lVar8;
  long lVar9;
  
  lVar9 = (long)y;
  lVar8 = (long)x;
  if (viz_clear[lVar9][lVar8] != '\0') goto LAB_00281957;
  viz_clear[lVar9][lVar8] = '\x01';
  if (x == 0x4f) {
    if (viz_clear[lVar9][0x4e] != '\0') {
      left_ptrs[lVar9][0x4f] = left_ptrs[lVar9][0x4e];
      goto LAB_00281957;
    }
    left_ptrs[lVar9][0x4f] = 'N';
    cVar1 = left_ptrs[lVar9][0x4e];
    if (0x4e < (long)cVar1) goto LAB_00281957;
    __s = right_ptrs[lVar9] + cVar1;
    __n = (ulong)(0x4e - (int)cVar1) + 1;
    iVar5 = 0x4e;
  }
  else {
    if (x != 0) {
      lVar6 = lVar8 + 1;
      cVar1 = viz_clear[lVar9][lVar8 + 1];
      iVar5 = (int)lVar6;
      if (viz_clear[lVar9 + -1][lVar8 + 0x4f] == '\0') {
        uVar3 = (uint)left_ptrs[lVar9 + -1][lVar8 + 0x4f];
        iVar2 = (int)(lVar8 + -1);
        cVar7 = (char)(lVar8 + -1);
        if (cVar1 == '\0') {
          if ((int)uVar3 < x) {
            memset(right_ptrs[lVar9] + (int)uVar3,iVar2,(ulong)(~uVar3 + x) + 1);
          }
          if (x < right_ptrs[lVar9][lVar6]) {
            memset(left_ptrs[lVar9] + lVar8 + 1,iVar5,
                   (ulong)(uint)((int)right_ptrs[lVar9][lVar6] + ~x) + 1);
          }
          left_ptrs[lVar9][lVar8] = cVar7;
          right_ptrs[lVar9][lVar8] = (char)lVar6;
        }
        else {
          if ((int)uVar3 < x) {
            memset(right_ptrs[lVar9] + (int)uVar3,iVar2,(ulong)(~uVar3 + x) + 1);
          }
          cVar1 = right_ptrs[lVar9][lVar6];
          if (x <= cVar1) {
            lVar6 = 0;
            do {
              if (viz_clear[lVar9][lVar6 + lVar8] != '\0') {
                left_ptrs[lVar9][lVar6 + lVar8] = cVar7;
              }
              lVar6 = lVar6 + 1;
            } while ((cVar1 - x) + 1 != (int)lVar6);
          }
          right_ptrs[lVar9][lVar8] = cVar1;
        }
      }
      else if (cVar1 == '\0') {
        if (x < right_ptrs[lVar9][lVar6]) {
          memset(left_ptrs[lVar9] + lVar8 + 1,iVar5,
                 (ulong)(uint)((int)right_ptrs[lVar9][lVar6] + ~x) + 1);
        }
        cVar1 = left_ptrs[lVar9 + -1][lVar8 + 0x4f];
        if (cVar1 <= x) {
          lVar4 = (long)(int)cVar1;
          do {
            if (viz_clear[lVar9][lVar4] != '\0') {
              right_ptrs[lVar9][lVar4] = (char)lVar6;
            }
            lVar4 = lVar4 + 1;
          } while (iVar5 != (int)lVar4);
        }
        left_ptrs[lVar9][lVar8] = cVar1;
      }
      else {
        iVar2 = (int)left_ptrs[lVar9 + -1][lVar8 + 0x4f];
        if (iVar2 <= x) {
          lVar4 = (long)iVar2;
          do {
            if (viz_clear[lVar9][lVar4] != '\0') {
              right_ptrs[lVar9][lVar4] = *(char *)(lVar8 + 0x35e071 + lVar9 * 0x50);
            }
            lVar4 = lVar4 + 1;
          } while (iVar5 != (int)lVar4);
        }
        cVar1 = right_ptrs[lVar9][lVar6];
        if (x <= cVar1) {
          lVar6 = 0;
          do {
            if (viz_clear[lVar9][lVar6 + lVar8] != '\0') {
              left_ptrs[lVar9][lVar6 + lVar8] = left_ptrs[lVar9 + -1][lVar8 + 0x4f];
            }
            lVar6 = lVar6 + 1;
          } while ((cVar1 - x) + 1 != (int)lVar6);
        }
      }
      goto LAB_00281957;
    }
    if (viz_clear[lVar9][1] != '\0') {
      right_ptrs[lVar9][0] = right_ptrs[lVar9][1];
      goto LAB_00281957;
    }
    right_ptrs[lVar9][0] = '\x01';
    __n = (size_t)right_ptrs[lVar9][1];
    if ((long)__n < 1) goto LAB_00281957;
    __s = left_ptrs[lVar9] + 1;
    iVar5 = 1;
  }
  memset(__s,iVar5,__n);
LAB_00281957:
  if (viz_array[lVar9][lVar8] != '\0') {
    vision_full_recalc = '\x01';
  }
  return;
}

Assistant:

static void dig_point(int row, int col)
{
    int i;

    if (viz_clear[row][col]) return;		/* already done */

    viz_clear[row][col] = 1;

    /*
     * Boundary cases first.
     */
    if (col == 0) {				/* left edge */
	if (viz_clear[row][1]) {
	    right_ptrs[row][0] = right_ptrs[row][1];
	} else {
	    right_ptrs[row][0] = 1;
	    for (i = 1; i <= right_ptrs[row][1]; i++)
		left_ptrs[row][i] = 1;
	}
    } else if (col == (COLNO-1)) {		/* right edge */

	if (viz_clear[row][COLNO-2]) {
	    left_ptrs[row][COLNO-1] = left_ptrs[row][COLNO-2];
	} else {
	    left_ptrs[row][COLNO-1] = COLNO-2;
	    for (i = left_ptrs[row][COLNO-2]; i < COLNO-1; i++)
		right_ptrs[row][i] = COLNO-2;
	}
    }

    /*
     * At this point, we know we aren't on the boundaries.
     */
    else if (viz_clear[row][col-1] && viz_clear[row][col+1]) {
	/* Both sides clear */
	for (i = left_ptrs[row][col-1]; i <= col; i++) {
	    if (!viz_clear[row][i]) continue;	/* catch non-end case */
	    right_ptrs[row][i] = right_ptrs[row][col+1];
	}
	for (i = col; i <= right_ptrs[row][col+1]; i++) {
	    if (!viz_clear[row][i]) continue;	/* catch non-end case */
	    left_ptrs[row][i] = left_ptrs[row][col-1];
	}

    } else if (viz_clear[row][col-1]) {
	/* Left side clear, right side blocked. */
	for (i = col+1; i <= right_ptrs[row][col+1]; i++)
	    left_ptrs[row][i] = col+1;

	for (i = left_ptrs[row][col-1]; i <= col; i++) {
	    if (!viz_clear[row][i]) continue;	/* catch non-end case */
	    right_ptrs[row][i] = col+1;
	}
	left_ptrs[row][col] = left_ptrs[row][col-1];

    } else if (viz_clear[row][col+1]) {
	/* Right side clear, left side blocked. */
	for (i = left_ptrs[row][col-1]; i < col; i++)
	    right_ptrs[row][i] = col-1;

	for (i = col; i <= right_ptrs[row][col+1]; i++) {
	    if (!viz_clear[row][i]) continue;	/* catch non-end case */
	    left_ptrs[row][i] = col-1;
	}
	right_ptrs[row][col] = right_ptrs[row][col+1];

    } else {
	/* Both sides blocked */
	for (i = left_ptrs[row][col-1]; i < col; i++)
	    right_ptrs[row][i] = col-1;

	for (i = col+1; i <= right_ptrs[row][col+1]; i++)
	    left_ptrs[row][i] = col+1;

	left_ptrs[row][col]  = col-1;
	right_ptrs[row][col] = col+1;
    }
}